

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_DCT.cc
# Opt level: O1

void __thiscall Pl_DCT::compress(Pl_DCT *this,void *cinfo_p,Buffer *b)

{
  int iVar1;
  int i;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Pipeline *pPVar5;
  Members *pMVar6;
  CompressConfig *pCVar7;
  void *__s;
  undefined8 *puVar8;
  size_t sVar9;
  uchar *puVar10;
  runtime_error *this_00;
  long *plVar11;
  size_type *psVar12;
  type ii;
  unsigned_long __val;
  JSAMPROW row_pointer [1];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  jpeg_CreateCompress(cinfo_p,0x50,0x248);
  __s = operator_new__(0x10000);
  memset(__s,0,0x10000);
  pPVar5 = (this->super_Pipeline).next_;
  puVar8 = (undefined8 *)(*(code *)**(undefined8 **)((long)cinfo_p + 8))(cinfo_p,0,0x40);
  *(undefined8 **)((long)cinfo_p + 0x28) = puVar8;
  puVar8[2] = init_pipeline_destination;
  puVar8[3] = empty_pipeline_output_buffer;
  puVar8[4] = term_pipeline_destination;
  puVar8[5] = __s;
  *puVar8 = __s;
  puVar8[6] = 0x10000;
  puVar8[1] = 0x10000;
  puVar8[7] = pPVar5;
  pMVar6 = (this->m)._M_t.
           super___uniq_ptr_impl<Pl_DCT::Members,_std::default_delete<Pl_DCT::Members>_>._M_t.
           super__Tuple_impl<0UL,_Pl_DCT::Members_*,_std::default_delete<Pl_DCT::Members>_>.
           super__Head_base<0UL,_Pl_DCT::Members_*,_false>._M_head_impl;
  *(JDIMENSION *)((long)cinfo_p + 0x30) = pMVar6->image_width;
  *(JDIMENSION *)((long)cinfo_p + 0x34) = pMVar6->image_height;
  *(int *)((long)cinfo_p + 0x38) = pMVar6->components;
  *(J_COLOR_SPACE *)((long)cinfo_p + 0x3c) = pMVar6->color_space;
  jpeg_set_defaults(cinfo_p);
  pCVar7 = ((this->m)._M_t.
            super___uniq_ptr_impl<Pl_DCT::Members,_std::default_delete<Pl_DCT::Members>_>._M_t.
            super__Tuple_impl<0UL,_Pl_DCT::Members_*,_std::default_delete<Pl_DCT::Members>_>.
            super__Head_base<0UL,_Pl_DCT::Members_*,_false>._M_head_impl)->config_callback;
  if (pCVar7 != (CompressConfig *)0x0) {
    (*pCVar7->_vptr_CompressConfig[2])(pCVar7,cinfo_p);
  }
  jpeg_start_compress(cinfo_p,1);
  iVar1 = *(int *)((long)cinfo_p + 0x30);
  if (*(int *)((long)cinfo_p + 0x38) < 0) {
    QIntC::IntConverter<int,_unsigned_int,_true,_false>::error(*(int *)((long)cinfo_p + 0x38));
  }
  i = *(int *)((long)cinfo_p + 0x38);
  uVar2 = *(uint *)((long)cinfo_p + 0x30);
  uVar3 = *(uint *)((long)cinfo_p + 0x34);
  if (i < 0) {
    QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(i);
  }
  iVar4 = *(int *)((long)cinfo_p + 0x38);
  sVar9 = Buffer::getSize(b);
  __val = (ulong)uVar2 * (ulong)uVar3 * (long)iVar4;
  if (sVar9 == __val) {
    puVar10 = Buffer::getBuffer(b);
    while (*(uint *)((long)cinfo_p + 0x154) < *(uint *)((long)cinfo_p + 0x34)) {
      local_b0._M_dataplus._M_p = (pointer)(puVar10 + *(uint *)((long)cinfo_p + 0x154) * i * iVar1);
      jpeg_write_scanlines(cinfo_p,&local_b0,1);
    }
    jpeg_finish_compress(cinfo_p);
    (*((this->super_Pipeline).next_)->_vptr_Pipeline[3])();
    operator_delete__(__s);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  sVar9 = Buffer::getSize(b);
  std::__cxx11::to_string(&local_70,sVar9);
  std::operator+(&local_50,"Pl_DCT: image buffer size = ",&local_70);
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_d0._M_dataplus._M_p = (pointer)*plVar11;
  psVar12 = (size_type *)(plVar11 + 2);
  if ((size_type *)local_d0._M_dataplus._M_p == psVar12) {
    local_d0.field_2._M_allocated_capacity = *psVar12;
    local_d0.field_2._8_8_ = plVar11[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar12;
  }
  local_d0._M_string_length = plVar11[1];
  *plVar11 = (long)psVar12;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  std::__cxx11::to_string(&local_90,__val);
  std::operator+(&local_b0,&local_d0,&local_90);
  std::runtime_error::runtime_error(this_00,(string *)&local_b0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
Pl_DCT::compress(void* cinfo_p, Buffer* b)
{
    auto* cinfo = reinterpret_cast<jpeg_compress_struct*>(cinfo_p);

#if ((defined(__GNUC__) && ((__GNUC__ * 100) + __GNUC_MINOR__) >= 406) || defined(__clang__))
# pragma GCC diagnostic push
# pragma GCC diagnostic ignored "-Wold-style-cast"
#endif
    jpeg_create_compress(cinfo);
#if ((defined(__GNUC__) && ((__GNUC__ * 100) + __GNUC_MINOR__) >= 406) || defined(__clang__))
# pragma GCC diagnostic pop
#endif
    static int const BUF_SIZE = 65536;
    auto outbuffer_ph = std::make_unique<unsigned char[]>(BUF_SIZE);
    unsigned char* outbuffer = outbuffer_ph.get();
    jpeg_pipeline_dest(cinfo, outbuffer, BUF_SIZE, next());

    cinfo->image_width = m->image_width;
    cinfo->image_height = m->image_height;
    cinfo->input_components = m->components;
    cinfo->in_color_space = m->color_space;
    jpeg_set_defaults(cinfo);
    if (m->config_callback) {
        m->config_callback->apply(cinfo);
    }

    jpeg_start_compress(cinfo, TRUE);

    unsigned int width = cinfo->image_width * QIntC::to_uint(cinfo->input_components);
    size_t expected_size = QIntC::to_size(cinfo->image_height) *
        QIntC::to_size(cinfo->image_width) * QIntC::to_size(cinfo->input_components);
    if (b->getSize() != expected_size) {
        throw std::runtime_error(
            "Pl_DCT: image buffer size = " + std::to_string(b->getSize()) +
            "; expected size = " + std::to_string(expected_size));
    }
    JSAMPROW row_pointer[1];
    unsigned char* buffer = b->getBuffer();
    while (cinfo->next_scanline < cinfo->image_height) {
        // We already verified that the buffer is big enough.
        row_pointer[0] = &buffer[cinfo->next_scanline * width];
        (void)jpeg_write_scanlines(cinfo, row_pointer, 1);
    }
    jpeg_finish_compress(cinfo);
    next()->finish();
}